

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synchmanager.cpp
# Opt level: O0

void __thiscall
CorUnix::CPalSynchronizationManager::DiscardAllPendingAPCs
          (CPalSynchronizationManager *this,CPalThread *pthrCurrent,CPalThread *pthrTarget)

{
  _ThreadApcInfoNode *p_Var1;
  _ThreadApcInfoNode *local_30;
  ThreadApcInfoNode *ptainLocalHead;
  ThreadApcInfoNode *ptainNode;
  CPalThread *pthrTarget_local;
  CPalThread *pthrCurrent_local;
  CPalSynchronizationManager *this_local;
  
  CPalThread::Lock(pthrTarget,pthrCurrent);
  local_30 = (pthrTarget->apcInfo).m_ptainHead;
  if (local_30 != (PThreadApcInfoNode)0x0) {
    (pthrTarget->apcInfo).m_ptainHead = (PThreadApcInfoNode)0x0;
    (pthrTarget->apcInfo).m_ptainTail = (PThreadApcInfoNode)0x0;
  }
  CPalThread::Unlock(pthrTarget,pthrCurrent);
  while (local_30 != (_ThreadApcInfoNode *)0x0) {
    p_Var1 = local_30->pNext;
    CSynchCache<CorUnix::_ThreadApcInfoNode>::Add
              (&this->m_cacheThreadApcInfoNodes,pthrCurrent,local_30);
    local_30 = p_Var1;
  }
  return;
}

Assistant:

void CPalSynchronizationManager::DiscardAllPendingAPCs(
        CPalThread * pthrCurrent,
        CPalThread * pthrTarget)
    {
        ThreadApcInfoNode * ptainNode, * ptainLocalHead;

        // Lock
        pthrTarget->Lock(pthrCurrent);
        ptainLocalHead = pthrTarget->apcInfo.m_ptainHead;
        if (ptainLocalHead)
        {
            pthrTarget->apcInfo.m_ptainHead = NULL;
            pthrTarget->apcInfo.m_ptainTail = NULL;
        }
        // Unlock
        pthrTarget->Unlock(pthrCurrent);

        while (ptainLocalHead)
        {
            ptainNode = ptainLocalHead;
            ptainLocalHead = ptainNode->pNext;

            m_cacheThreadApcInfoNodes.Add(pthrCurrent, ptainNode);
        }
    }